

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1;
  SeparatedSyntaxList<slang::syntax::SyntaxNode> *args_4;
  SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_8;
  StatementSyntax *args_10;
  ForLoopStatementSyntax *pFVar1;
  DeepCloneVisitor visitor_2;
  SyntaxNode *local_90;
  DeepCloneVisitor visitor;
  NamedLabelSyntax *local_78;
  Token local_70;
  Token local_60;
  DeepCloneVisitor visitor_1;
  Token local_40;
  
  if (*(SyntaxNode **)(__fn + 0x18) == (SyntaxNode *)0x0) {
    local_78 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_78 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x18),&visitor,(BumpAllocator *)__child_stack);
  }
  args_1 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x20),
                      (BumpAllocator *)__child_stack);
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x58),(BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x68),(BumpAllocator *)__child_stack);
  args_4 = deepClone<slang::syntax::SyntaxNode>
                     ((SeparatedSyntaxList<slang::syntax::SyntaxNode> *)(__fn + 0x78),
                      (BumpAllocator *)__child_stack);
  local_70 = parsing::Token::deepClone((Token *)(__fn + 0xb0),(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0xc0) == (SyntaxNode *)0x0) {
    local_90 = (SyntaxNode *)0x0;
  }
  else {
    local_90 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0xc0),&visitor_1,(BumpAllocator *)__child_stack);
  }
  _visitor_1 = parsing::Token::deepClone((Token *)(__fn + 200),(BumpAllocator *)__child_stack);
  args_8 = deepClone<slang::syntax::ExpressionSyntax>
                     ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)(__fn + 0xd8),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x110),(BumpAllocator *)__child_stack);
  args_10 = (StatementSyntax *)
            detail::
            visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                      (*(SyntaxNode **)(__fn + 0x120),&visitor_2,(BumpAllocator *)__child_stack);
  pFVar1 = BumpAllocator::
           emplace<slang::syntax::ForLoopStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::SyntaxNode>&,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token,slang::syntax::StatementSyntax&>
                     ((BumpAllocator *)__child_stack,&local_78,args_1,(Token *)&visitor,&local_60,
                      args_4,&local_70,(ExpressionSyntax **)&local_90,(Token *)&visitor_1,args_8,
                      &local_40,args_10);
  return (int)pFVar1;
}

Assistant:

static SyntaxNode* clone(const ForLoopStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ForLoopStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        node.forKeyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone(node.initializers, alloc),
        node.semi1.deepClone(alloc),
        node.stopExpr ? deepClone(*node.stopExpr, alloc) : nullptr,
        node.semi2.deepClone(alloc),
        *deepClone(node.steps, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc)
    );
}